

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void process_bb_ranges(gen_ctx_t gen_ctx,bb_t_conflict bb,MIR_insn_t start_insn,MIR_insn_t tail_insn
                      )

{
  bb_t *ppbVar1;
  int *piVar2;
  void **ppvVar3;
  char cVar4;
  lr_ctx *plVar5;
  bitmap_t pVVar6;
  MIR_context_t pMVar7;
  FILE *pFVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  lr_bb_t_conflict *pplVar12;
  MIR_reg_t MVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  MIR_type_t tp;
  bb_t_conflict pbVar17;
  bb_t_conflict extraout_RAX;
  bb_t_conflict extraout_RAX_00;
  bitmap_t pVVar18;
  lr_bb_t_conflict plVar19;
  VARR_live_range_t *pVVar20;
  FILE *__s;
  live_range_t_conflict plVar21;
  ulong uVar22;
  MIR_context_t pMVar23;
  ulong uVar24;
  bitmap_t pVVar25;
  live_range_t plVar26;
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  size_t sVar27;
  ulong uVar28;
  gen_ctx_t unaff_RBP;
  gen_ctx_t pgVar29;
  gen_ctx_t pgVar30;
  gen_ctx_t pgVar31;
  live_range_t_conflict plVar32;
  live_range_t_conflict nb;
  char *pcVar33;
  int iVar34;
  _IO_FILE *in_R8;
  ulong uVar35;
  gen_ctx_t unaff_R14;
  gen_ctx_t pgVar36;
  gen_ctx_t pgVar37;
  _IO_FILE **pp_Var38;
  int out_p;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  int local_54;
  gen_ctx_t local_50;
  uint local_44;
  MIR_reg_t local_40;
  MIR_reg_t local_3c;
  gen_ctx_t local_38;
  
  pgVar36 = (gen_ctx_t)gen_ctx->debug_file;
  if ((pgVar36 != (gen_ctx_t)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)pgVar36,"  ------BB%u end: point=%d\n",(ulong)(uint)bb->index,
            (ulong)(uint)gen_ctx->lr_ctx->curr_point);
  }
  plVar5 = gen_ctx->lr_ctx;
  pVVar6 = plVar5->referenced_vars;
  if ((pVVar6 == (bitmap_t)0x0) || (pVVar6->varr == (bitmap_el_t *)0x0)) {
    process_bb_ranges_cold_14();
  }
  else {
    pVVar6->els_num = 0;
    pVVar6 = plVar5->live_vars;
    if ((pVVar6 != (bitmap_t)0x0) && (pVVar6->varr != (bitmap_el_t *)0x0)) {
      pVVar6->els_num = 0;
      pVVar6 = bb->out;
      pbVar17 = bb;
      local_38 = (gen_ctx_t)start_insn;
      if (pVVar6 != (bitmap_t)0x0) {
        pgVar36 = (gen_ctx_t)0x0;
        do {
          uVar22 = (ulong)pgVar36 >> 6;
          uVar35 = pVVar6->els_num;
          pbVar17 = (bb_t_conflict)CONCAT71((int7)((ulong)pbVar17 >> 8),1);
          unaff_R14 = pgVar36;
          if (uVar22 < uVar35) {
            unaff_R14 = (gen_ctx_t)(uVar35 << 6);
LAB_0016f00d:
            in_R8 = (_IO_FILE *)pVVar6->varr[uVar22];
            if ((in_R8 == (_IO_FILE *)0x0) ||
               (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar36 & 0x3f)),
               in_R8 == (_IO_FILE *)0x0)) goto LAB_0016f020;
            uVar35 = (ulong)in_R8 & 1;
            unaff_RBP = pgVar36;
            while (uVar35 == 0) {
              unaff_RBP = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
              uVar35 = (ulong)in_R8 & 2;
              in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
            }
            unaff_R14 = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
            pbVar17 = (bb_t_conflict)0x0;
          }
LAB_0016f054:
          if ((char)pbVar17 != '\0') break;
          MVar13 = scan_var_to_var(gen_ctx,(int)unaff_RBP);
          in_R8 = (_IO_FILE *)0x0;
          uVar14 = make_var_live(gen_ctx,MVar13,(int)unaff_RBP,gen_ctx->lr_ctx->curr_point,0);
          pbVar17 = (bb_t_conflict)(ulong)uVar14;
          pgVar36 = unaff_R14;
        } while( true );
      }
      do {
        pgVar36 = (gen_ctx_t)gen_ctx->debug_file;
        if ((pgVar36 != (gen_ctx_t)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)pgVar36,"  p%-5d",(ulong)(uint)gen_ctx->lr_ctx->curr_point);
          pgVar36 = (gen_ctx_t)gen_ctx->ctx;
          in_R8 = (_IO_FILE *)0x1;
          MIR_output_insn((MIR_context_t)pgVar36,gen_ctx->debug_file,tail_insn,
                          (gen_ctx->curr_func_item->u).func,1);
          pbVar17 = extraout_RAX;
        }
        if ((int)((gen_ctx_t)tail_insn)->debug_file != 0xba) {
          uVar22 = (ulong)((gen_ctx_t)tail_insn)->debug_file >> 0x20;
          uVar35 = 0;
          local_44 = (uint)CONCAT71((int7)((ulong)pbVar17 >> 8),1);
          bVar11 = false;
          local_50 = unaff_RBP;
LAB_0016f142:
          bVar10 = true;
          if (uVar35 < uVar22) {
            pp_Var38 = (_IO_FILE **)(((gen_ctx_t)tail_insn)->call_used_hard_regs + uVar35 * 6 + -7);
            do {
              sVar27 = uVar35;
              pgVar36 = (gen_ctx_t)gen_ctx->ctx;
              MIR_insn_op_mode((MIR_context_t)pgVar36,tail_insn,sVar27,&local_54);
              if ((local_54 != 0) && (*(char *)(pp_Var38 + -1) != '\v')) {
                if (*(char *)(pp_Var38 + -1) != '\x02') {
                  __assert_fail("op_ref->mode == MIR_OP_VAR",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x4ff,
                                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                               );
                }
                unaff_R14 = (gen_ctx_t)(ulong)*(uint *)pp_Var38;
                bVar10 = false;
                break;
              }
              pp_Var38 = pp_Var38 + 6;
              uVar35 = sVar27 + 1;
            } while (uVar22 != sVar27 + 1);
            uVar35 = sVar27 + 1;
          }
          if (!bVar10) {
            pgVar36 = gen_ctx;
            iVar16 = var_to_scan_var(gen_ctx,(MIR_reg_t)unaff_R14);
            if (-1 < iVar16) {
              bVar11 = true;
              in_R8 = (_IO_FILE *)0x1;
              pgVar36 = gen_ctx;
              make_var_dead(gen_ctx,(MIR_reg_t)unaff_R14,iVar16,gen_ctx->lr_ctx->curr_point,1);
              local_44 = 0;
            }
            goto LAB_0016f142;
          }
          pbVar17 = (bb_t_conflict)gen_ctx->lr_ctx;
          pgVar31 = local_50;
          if ((*(int *)((long)&pbVar17->index + 4) != 0) ||
             (*(int *)&((gen_ctx_t)tail_insn)->debug_file - 0xaaU < 0xfffffffd)) {
LAB_0016f472:
            if (bVar11) {
              pbVar17 = (bb_t_conflict)gen_ctx->lr_ctx;
              ppbVar1 = &(pbVar17->bb_link).next;
              *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
            }
            uVar28 = (ulong)*(uint *)((long)&((gen_ctx_t)tail_insn)->debug_file + 4);
            uVar22 = 0;
            uVar35 = 0;
            uVar14 = 0;
            local_50 = pgVar31;
LAB_0016f49b:
            bVar11 = true;
            uVar24 = uVar35;
            if (uVar22 < uVar28) {
              do {
                pgVar36 = (gen_ctx_t)gen_ctx->ctx;
                MIR_insn_op_mode((MIR_context_t)pgVar36,tail_insn,uVar22,&local_54);
                pbVar17 = (bb_t_conflict)
                          (((gen_ctx_t)tail_insn)->call_used_hard_regs + uVar22 * 6 + -9);
                if ((local_54 == 0) || (uVar35 = uVar24, (char)pbVar17->pre == '\v')) {
                  if (uVar24 < 2) {
                    cVar4 = (char)pbVar17->pre;
                    while (cVar4 == '\v') {
                      uVar15 = *(uint *)((long)&(pbVar17->bb_link).prev + (ulong)(uVar24 != 0) * 4);
                      unaff_R14 = (gen_ctx_t)(ulong)uVar15;
                      if (uVar15 != 0xffffffff) goto LAB_0016f533;
                      if (uVar24 != 0) goto LAB_0016f51f;
                      uVar24 = 1;
                    }
                    if (uVar24 != 1) {
                      uVar35 = 0;
                      if (cVar4 != '\x02') goto LAB_0016f521;
                      unaff_R14 = (gen_ctx_t)(ulong)(uint)pbVar17->rpost;
LAB_0016f533:
                      uVar35 = uVar24 + 1;
                      bVar11 = false;
                      break;
                    }
                  }
LAB_0016f51f:
                  uVar35 = 0;
                }
LAB_0016f521:
                uVar22 = uVar22 + 1;
                uVar24 = uVar35;
              } while (uVar22 != uVar28);
            }
            if (!bVar11) {
              pgVar36 = gen_ctx;
              uVar15 = var_to_scan_var(gen_ctx,(MIR_reg_t)unaff_R14);
              pbVar17 = (bb_t_conflict)(ulong)uVar15;
              if (-1 < (int)uVar15) {
                in_R8 = (_IO_FILE *)0x1;
                pgVar36 = gen_ctx;
                uVar15 = make_var_live(gen_ctx,(MIR_reg_t)unaff_R14,uVar15,
                                       gen_ctx->lr_ctx->curr_point,1);
                pbVar17 = (bb_t_conflict)(ulong)uVar15;
                uVar14 = uVar14 | uVar15;
              }
              goto LAB_0016f49b;
            }
            plVar5 = gen_ctx->lr_ctx;
            unaff_RBP = local_50;
            if (plVar5->scan_vars_num == 0) {
              pgVar36 = (gen_ctx_t)tail_insn;
              target_get_early_clobbered_hard_regs(tail_insn,&local_3c,&local_40);
              MVar13 = local_3c;
              unaff_RBP = local_50;
              pbVar17 = extraout_RAX_00;
              if (local_3c != 0xffffffff) {
                uVar14 = 1;
                make_var_live(gen_ctx,local_3c,local_3c,plVar5->curr_point,1);
                in_R8 = (_IO_FILE *)0x1;
                pgVar36 = gen_ctx;
                uVar15 = make_var_dead(gen_ctx,MVar13,MVar13,gen_ctx->lr_ctx->curr_point,1);
                pbVar17 = (bb_t_conflict)(ulong)uVar15;
              }
              MVar13 = local_40;
              if (local_40 != 0xffffffff) {
                uVar14 = 1;
                make_var_live(gen_ctx,local_40,local_40,gen_ctx->lr_ctx->curr_point,1);
                in_R8 = (_IO_FILE *)0x1;
                pgVar36 = gen_ctx;
                uVar15 = make_var_dead(gen_ctx,MVar13,MVar13,gen_ctx->lr_ctx->curr_point,1);
                pbVar17 = (bb_t_conflict)(ulong)uVar15;
              }
            }
            start_insn = (MIR_insn_t)local_38;
            if (uVar14 != 0) {
              pbVar17 = (bb_t_conflict)gen_ctx->lr_ctx;
              ppbVar1 = &(pbVar17->bb_link).next;
              *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
            }
            goto LAB_0016f667;
          }
          if ((local_44 & 1) == 0) {
            ppbVar1 = &(pbVar17->bb_link).next;
            *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
          }
          pVVar6 = gen_ctx->call_used_hard_regs[0x12];
          if (pVVar6 != (bitmap_t)0x0) {
            bVar11 = false;
            pgVar37 = (gen_ctx_t)0x0;
            do {
              uVar22 = (ulong)pgVar37 >> 6;
              uVar35 = pVVar6->els_num;
              bVar10 = true;
              pgVar29 = pgVar37;
              if (uVar22 < uVar35) {
                pgVar36 = (gen_ctx_t)pVVar6->varr;
                pgVar29 = (gen_ctx_t)(uVar35 << 6);
LAB_0016f265:
                in_R8 = (_IO_FILE *)pgVar36->call_used_hard_regs[uVar22 - 0xd];
                if ((in_R8 == (_IO_FILE *)0x0) ||
                   (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar37 & 0x3f)),
                   in_R8 == (_IO_FILE *)0x0)) goto LAB_0016f278;
                uVar35 = (ulong)in_R8 & 1;
                pgVar31 = pgVar37;
                while (uVar35 == 0) {
                  pgVar31 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
                  uVar35 = (ulong)in_R8 & 2;
                  in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
                }
                pgVar29 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
                bVar10 = false;
              }
LAB_0016f2ac:
              if (bVar10) goto LAB_0016f2e0;
              bVar11 = true;
              in_R8 = (_IO_FILE *)0x1;
              pgVar36 = gen_ctx;
              make_var_dead(gen_ctx,(MIR_reg_t)pgVar31,(MIR_reg_t)pgVar31,
                            gen_ctx->lr_ctx->curr_point,1);
              pgVar37 = pgVar29;
              if (pVVar6 == (bitmap_t)0x0) break;
            } while( true );
          }
          process_bb_ranges_cold_3();
          goto LAB_0016f9ec;
        }
        pgVar36 = gen_ctx;
        uVar14 = var_to_scan_var(gen_ctx,((gen_ctx_t)tail_insn)->addr_insn_p);
        pbVar17 = (bb_t_conflict)(ulong)uVar14;
        if (-1 < (int)uVar14) {
          in_R8 = (_IO_FILE *)0x1;
          pgVar36 = gen_ctx;
          make_var_dead(gen_ctx,((gen_ctx_t)tail_insn)->addr_insn_p,uVar14,
                        gen_ctx->lr_ctx->curr_point,1);
          pbVar17 = (bb_t_conflict)gen_ctx->lr_ctx;
          ppbVar1 = &(pbVar17->bb_link).next;
          *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
        }
LAB_0016f667:
        if (tail_insn == start_insn) goto LAB_0016f676;
        tail_insn = *(MIR_insn_t *)&((gen_ctx_t)tail_insn)->optimize_level;
      } while( true );
    }
  }
  process_bb_ranges_cold_13();
LAB_0016fa5d:
  process_bb_ranges_cold_12();
LAB_0016fa62:
  process_bb_ranges_cold_11();
LAB_0016fa67:
  process_bb_ranges_cold_7();
LAB_0016fa6c:
  process_bb_ranges_cold_10();
LAB_0016fa71:
  process_bb_ranges_cold_9();
  pMVar7 = pgVar36->ctx;
  __s = (FILE *)pgVar36->debug_file;
  pcVar33 = "+++++++++++++Live ranges:\n";
  plVar32 = (live_range_t_conflict)0x1a;
  fwrite("+++++++++++++Live ranges:\n",0x1a,1,__s);
  pVVar20 = pgVar36->lr_ctx->var_live_ranges;
  if (pVVar20 != (VARR_live_range_t *)0x0) {
    uVar35 = 0;
    do {
      iVar16 = (int)in_R8;
      uVar14 = (uint)__s;
      if (pVVar20->els_num <= uVar35) {
        return;
      }
      if (pVVar20->varr == (live_range_t_conflict *)0x0) {
        print_all_live_ranges_cold_1();
        plVar5 = ((gen_ctx_t)pcVar33)->lr_ctx;
        pVVar20 = plVar5->var_live_ranges;
        iVar34 = iVar16;
        if (((pVVar20 == (VARR_live_range_t *)0x0) ||
            (pVVar20->varr == (live_range_t_conflict *)0x0)) ||
           (uVar35 = (ulong)plVar32 & 0xffffffff, pVVar20->els_num <= uVar35)) {
          make_var_live_cold_4();
LAB_0016fd23:
          make_var_live_cold_2();
          nb = plVar32;
          pgVar31 = (gen_ctx_t)pcVar33;
LAB_0016fd28:
          make_var_live_cold_3();
        }
        else {
          plVar21 = pVVar20->varr[uVar35];
          if ((iVar16 == 0) || (plVar5->scan_vars_num != 0)) {
LAB_0016fc60:
            pgVar36 = (gen_ctx_t)((gen_ctx_t)pcVar33)->lr_ctx->live_vars;
            uVar22 = (ulong)extraout_EDX;
            nb = (live_range_t_conflict)(uVar22 + 1);
            pgVar31 = pgVar36;
            bitmap_expand((bitmap_t)pgVar36,(size_t)nb);
            if (pgVar36 != (gen_ctx_t)0x0) {
              pvVar9 = (&pgVar36->curr_func_item->data)[uVar22 >> 6];
              (&pgVar36->curr_func_item->data)[uVar22 >> 6] =
                   (void *)((ulong)pvVar9 | 1L << (uVar22 & 0x3f));
              if ((((ulong)pvVar9 >> (uVar22 & 0x3f) & 1) != 0) ||
                 (((iVar16 != 0 && (plVar21 != (live_range_t_conflict)0x0)) &&
                  ((plVar21->lr_bb == (lr_bb_t_conflict)0x0 &&
                   (plVar21->finish + 1U == uVar14 || plVar21->finish == uVar14)))))) {
                return;
              }
              pVVar20 = ((gen_ctx_t)pcVar33)->lr_ctx->var_live_ranges;
              plVar32 = (live_range_t_conflict)(ulong)uVar14;
              plVar21 = create_live_range((gen_ctx_t)pcVar33,uVar14,-1,plVar21);
              if (((pVVar20 != (VARR_live_range_t *)0x0) &&
                  (pVVar20->varr != (live_range_t_conflict *)0x0)) && (uVar35 < pVVar20->els_num)) {
                pVVar20->varr[uVar35] = plVar21;
                return;
              }
              goto LAB_0016fd23;
            }
            goto LAB_0016fd28;
          }
          pgVar36 = (gen_ctx_t)plVar5->referenced_vars;
          nb = (live_range_t_conflict)(uVar35 + 1);
          pgVar31 = pgVar36;
          bitmap_expand((bitmap_t)pgVar36,(size_t)nb);
          if (pgVar36 != (gen_ctx_t)0x0) {
            ppvVar3 = &pgVar36->curr_func_item->data + (uVar35 >> 6);
            *ppvVar3 = (void *)((ulong)*ppvVar3 | 1L << ((ulong)plVar32 & 0x3f));
            goto LAB_0016fc60;
          }
        }
        make_var_live_cold_1();
        if (pgVar31->lr_ctx->scan_vars_num == 0) {
          return;
        }
        if ((int)nb < 0) {
LAB_0016fd6b:
          __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
        }
        plVar26 = (live_range_t)pgVar31->lr_ctx->scan_var_to_var_map;
        if (plVar26 == (live_range_t)0x0) {
          scan_var_to_var_cold_2();
        }
        else {
          pplVar12 = &plVar26->lr_bb;
          if ((int)*pplVar12 <= (int)nb) goto LAB_0016fd6b;
          plVar26 = *(live_range_t *)&plVar26->ref_cost;
          if ((plVar26 != (live_range_t)0x0) &&
             ((lr_bb_t_conflict)((ulong)nb & 0xffffffff) < *pplVar12)) {
            return;
          }
        }
        scan_var_to_var_cold_1();
        uVar14 = (uint)nb;
        uVar15 = (uint)plVar26;
        uVar35 = (ulong)nb & 0xffffffff;
        pgVar36 = pgVar31;
        if ((iVar34 != 0) && (pgVar31->lr_ctx->scan_vars_num == 0)) {
          pgVar37 = (gen_ctx_t)pgVar31->lr_ctx->referenced_vars;
          sVar27 = uVar35 + 1;
          pgVar36 = pgVar37;
          bitmap_expand((bitmap_t)pgVar37,sVar27);
          uVar14 = (uint)sVar27;
          if (pgVar37 == (gen_ctx_t)0x0) goto LAB_0016fe7f;
          plVar26 = (live_range_t)(uVar35 >> 6);
          ppvVar3 = &pgVar37->curr_func_item->data + (long)plVar26;
          *ppvVar3 = (void *)((ulong)*ppvVar3 | 1L << ((ulong)nb & 0x3f));
        }
        pVVar20 = pgVar31->lr_ctx->var_live_ranges;
        if (((pVVar20 == (VARR_live_range_t *)0x0) ||
            (plVar26 = (live_range_t)pVVar20->varr, plVar26 == (live_range_t)0x0)) ||
           (pVVar20->els_num <= uVar35)) {
          make_var_dead_cold_4();
LAB_0016fe75:
          make_var_dead_cold_2();
        }
        else {
          pVVar6 = pgVar31->lr_ctx->live_vars;
          if (pVVar6 != (bitmap_t)0x0) {
            plVar32 = (live_range_t_conflict)(&plVar26->lr_bb)[uVar35];
            uVar22 = (ulong)extraout_EDX_00;
            if ((uVar22 < pVVar6->els_num << 6) &&
               (uVar28 = pVVar6->varr[uVar22 >> 6],
               pVVar6->varr[uVar22 >> 6] = uVar28 & ~(1L << (uVar22 & 0x3f)),
               (uVar28 >> (uVar22 & 0x3f) & 1) != 0)) {
              plVar32->finish = uVar15;
              return;
            }
            uVar14 = uVar15;
            plVar32 = create_live_range(pgVar31,uVar15,uVar15,plVar32);
            plVar26 = (live_range_t)pVVar20->varr;
            pgVar36 = pgVar31;
            if ((plVar26 != (live_range_t)0x0) && (uVar35 < pVVar20->els_num)) {
              (&plVar26->lr_bb)[uVar35] = (lr_bb_t_conflict)plVar32;
              return;
            }
            goto LAB_0016fe75;
          }
        }
        make_var_dead_cold_3();
LAB_0016fe7f:
        make_var_dead_cold_1();
        plVar32 = pgVar36->lr_ctx->free_lr_list;
        if (plVar32 == (live_range_t_conflict)0x0) {
          plVar32 = (live_range_t_conflict)malloc(0x20);
          if (plVar32 == (live_range_t_conflict)0x0) {
            util_error(pgVar36,"no memory");
          }
        }
        else {
          pgVar36->lr_ctx->free_lr_list = plVar32->next;
        }
        if ((int)uVar14 < 0) {
          __assert_fail("start >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        if (extraout_EDX_01 < uVar14) {
          __assert_fail("finish < 0 || start <= finish",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        plVar32->start = uVar14;
        plVar32->finish = extraout_EDX_01;
        plVar32->ref_cost = 1;
        plVar32->next = plVar26;
        plVar32->lr_bb = (lr_bb_t_conflict)0x0;
        return;
      }
      plVar21 = pVVar20->varr[uVar35];
      if (plVar21 != (live_range_t_conflict)0x0) {
        fprintf((FILE *)pgVar36->debug_file,"%lu",uVar35);
        if (pgVar36->lr_ctx->scan_vars_num != 0) {
          pFVar8 = (FILE *)pgVar36->debug_file;
          iVar16 = var_to_scan_var(pgVar36,(MIR_reg_t)uVar35);
          fprintf(pFVar8," (%lu)",(long)iVar16);
        }
        if (0x21 < uVar35) {
          pFVar8 = (FILE *)pgVar36->debug_file;
          MVar13 = (MIR_reg_t)uVar35 - 0x21;
          tp = MIR_reg_type(pMVar7,MVar13,(pgVar36->curr_func_item->u).func);
          pcVar33 = MIR_type_str(pMVar7,tp);
          __s = (FILE *)MIR_reg_name(pMVar7,MVar13,(pgVar36->curr_func_item->u).func);
          fprintf(pFVar8," (%s:%s)",pcVar33);
        }
        fputc(0x3a,(FILE *)pgVar36->debug_file);
        pcVar33 = (char *)pgVar36;
        print_live_ranges(pgVar36,plVar21);
        plVar32 = plVar21;
      }
      uVar35 = uVar35 + 1;
      pVVar20 = pgVar36->lr_ctx->var_live_ranges;
    } while (pVVar20 != (VARR_live_range_t *)0x0);
  }
  print_all_live_ranges_cold_2();
  return;
LAB_0016f020:
  uVar22 = uVar22 + 1;
  pgVar36 = (gen_ctx_t)(uVar22 * 0x40);
  if (uVar35 == uVar22) goto LAB_0016f054;
  goto LAB_0016f00d;
LAB_0016f278:
  uVar22 = uVar22 + 1;
  pgVar37 = (gen_ctx_t)(uVar22 * 0x40);
  if (uVar35 == uVar22) goto LAB_0016f2ac;
  goto LAB_0016f265;
LAB_0016f2e0:
  pVVar6 = ((gen_ctx *)((gen_ctx_t)tail_insn)->ctx)->call_used_hard_regs
           [(ulong)(gen_ctx->optimize_level != 0) * 8 + -0xc];
  if (pVVar6 != (bitmap_t)0x0) {
    pgVar37 = (gen_ctx_t)0x0;
    do {
      uVar22 = (ulong)pgVar37 >> 6;
      uVar35 = pVVar6->els_num;
      bVar10 = true;
      pgVar29 = pgVar37;
      if (uVar22 < uVar35) {
        pgVar36 = (gen_ctx_t)pVVar6->varr;
        pgVar29 = (gen_ctx_t)(uVar35 << 6);
LAB_0016f322:
        in_R8 = (_IO_FILE *)pgVar36->call_used_hard_regs[uVar22 - 0xd];
        if ((in_R8 == (_IO_FILE *)0x0) ||
           (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar37 & 0x3f)), in_R8 == (_IO_FILE *)0x0)
           ) goto LAB_0016f335;
        uVar35 = (ulong)in_R8 & 1;
        pgVar31 = pgVar37;
        while (uVar35 == 0) {
          pgVar31 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
          uVar35 = (ulong)in_R8 & 2;
          in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
        }
        pgVar29 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
        bVar10 = false;
      }
LAB_0016f369:
      if (bVar10) break;
      in_R8 = (_IO_FILE *)0x1;
      pgVar36 = gen_ctx;
      make_var_live(gen_ctx,(MIR_reg_t)pgVar31,(MIR_reg_t)pgVar31,gen_ctx->lr_ctx->curr_point,1);
      pgVar37 = pgVar29;
    } while( true );
  }
  pbVar17 = (bb_t_conflict)gen_ctx->lr_ctx;
  pgVar37 = (gen_ctx_t)(pbVar17->in_edges).head;
  if (pgVar37 != (gen_ctx_t)0x0) {
    pgVar29 = (gen_ctx_t)0x0;
    local_50 = pgVar37;
    do {
      pMVar23 = (MIR_context_t)((ulong)pgVar29 >> 6);
      pMVar7 = pgVar37->ctx;
      pbVar17 = (bb_t_conflict)CONCAT71((int7)((ulong)pbVar17 >> 8),1);
      pgVar30 = pgVar29;
      if (pMVar23 < pMVar7) {
        pgVar36 = (gen_ctx_t)((DLIST_LINK_in_edge_t *)&pgVar37->curr_func_item)->prev;
        pgVar30 = (gen_ctx_t)((long)pMVar7 << 6);
LAB_0016f3c6:
        in_R8 = (_IO_FILE *)pgVar36->call_used_hard_regs[(long)((long)&pMVar23[-1].setjmp_addr + 3)]
        ;
        if ((in_R8 == (_IO_FILE *)0x0) ||
           (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar29 & 0x3f)), in_R8 == (_IO_FILE *)0x0)
           ) goto LAB_0016f3d9;
        uVar35 = (ulong)in_R8 & 1;
        pgVar31 = pgVar29;
        while (uVar35 == 0) {
          pgVar31 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
          uVar35 = (ulong)in_R8 & 2;
          in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
        }
        pgVar30 = (gen_ctx_t)((long)&pgVar31->ctx + 1);
        pbVar17 = (bb_t_conflict)0x0;
      }
LAB_0016f40d:
      if ((char)pbVar17 != '\0') goto LAB_0016f472;
      if ((gen_ctx_t)0x21 < pgVar31) {
        pgVar37 = (gen_ctx_t)gen_ctx->curr_cfg->call_crossed_regs;
        pgVar36 = pgVar37;
        bitmap_expand((bitmap_t)pgVar37,((ulong)pgVar31 & 0xffffffff) + 1);
        if (pgVar37 == (gen_ctx_t)0x0) goto LAB_0016f9f1;
        pbVar17 = (bb_t_conflict)pgVar37->curr_func_item;
        (&pbVar17->index)[(ulong)pgVar31 >> 6 & 0x3ffffff] =
             (size_t)((ulong)(&pbVar17->index)[(ulong)pgVar31 >> 6 & 0x3ffffff] |
                     1L << ((ulong)pgVar31 & 0x3f));
        pgVar37 = local_50;
      }
      pgVar29 = pgVar30;
      if (pgVar37 == (gen_ctx_t)0x0) break;
    } while( true );
  }
LAB_0016f9ec:
  process_bb_ranges_cold_2();
LAB_0016f9f1:
  process_bb_ranges_cold_1();
  goto LAB_0016f9f6;
LAB_0016f335:
  uVar22 = uVar22 + 1;
  pgVar37 = (gen_ctx_t)(uVar22 * 0x40);
  if (uVar35 == uVar22) goto LAB_0016f369;
  goto LAB_0016f322;
LAB_0016f3d9:
  pMVar23 = (MIR_context_t)((long)&pMVar23->gen_ctx + 1);
  pgVar29 = (gen_ctx_t)((long)pMVar23 * 0x40);
  if (pMVar7 == pMVar23) goto LAB_0016f40d;
  goto LAB_0016f3c6;
LAB_0016f676:
  pVVar6 = bb->in;
  if (pVVar6 == (bitmap_t)0x0) goto LAB_0016fa5d;
  pVVar25 = gen_ctx->lr_ctx->live_vars;
  if (pVVar25 == (bitmap_t)0x0) goto LAB_0016fa62;
  uVar35 = pVVar6->els_num;
  uVar22 = pVVar25->els_num;
  pVVar18 = pVVar6;
  uVar28 = uVar22;
  if (uVar22 < uVar35) {
    pVVar18 = pVVar25;
    pVVar25 = pVVar6;
    uVar28 = uVar35;
    uVar35 = uVar22;
  }
  pgVar36 = (gen_ctx_t)pVVar18->varr;
  pgVar37 = (gen_ctx_t)pVVar25->varr;
  pgVar31 = pgVar37;
  iVar16 = bcmp(pgVar36,pgVar37,uVar35 * 8);
  if (iVar16 != 0) goto LAB_0016f9fb;
  if (uVar35 < uVar28) {
    do {
      if (pgVar37->call_used_hard_regs[uVar35 - 0xd] != (bitmap_t)0x0) goto LAB_0016f9fb;
      uVar35 = uVar35 + 1;
    } while (uVar28 != uVar35);
  }
  pgVar37 = (gen_ctx_t)0x0;
LAB_0016f6fa:
  uVar22 = (ulong)pgVar37 >> 6;
  uVar35 = pVVar6->els_num;
  bVar11 = true;
  pgVar29 = pgVar37;
  if (uVar22 < uVar35) {
    pgVar36 = (gen_ctx_t)pVVar6->varr;
    pgVar31 = (gen_ctx_t)(uVar35 << 6);
LAB_0016f716:
    in_R8 = (_IO_FILE *)pgVar36->call_used_hard_regs[uVar22 - 0xd];
    if ((in_R8 == (_IO_FILE *)0x0) ||
       (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar37 & 0x3f)), in_R8 == (_IO_FILE *)0x0))
    goto LAB_0016f729;
    uVar35 = (ulong)in_R8 & 1;
    unaff_RBP = pgVar37;
    while (uVar35 == 0) {
      unaff_RBP = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
      uVar35 = (ulong)in_R8 & 2;
      in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
    }
    bVar11 = false;
    pgVar29 = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
  }
LAB_0016f75d:
  if (!bVar11) {
    MVar13 = scan_var_to_var(gen_ctx,(int)unaff_RBP);
    pgVar31 = (gen_ctx_t)(ulong)MVar13;
    in_R8 = (_IO_FILE *)0x0;
    pgVar36 = gen_ctx;
    make_var_dead(gen_ctx,MVar13,(int)unaff_RBP,gen_ctx->lr_ctx->curr_point,0);
    plVar5 = gen_ctx->lr_ctx;
    pgVar37 = pgVar29;
    if (plVar5->scan_vars_num == 0) {
      pVVar25 = plVar5->referenced_vars;
      if (pVVar25 == (bitmap_t)0x0) {
        process_bb_ranges_cold_5();
        goto LAB_0016fa3e;
      }
      if (((gen_ctx_t)(pVVar25->els_num << 6) <= unaff_RBP) ||
         ((pVVar25->varr[(ulong)unaff_RBP >> 6] >> ((ulong)unaff_RBP & 0x3f) & 1) == 0)) {
        pVVar20 = plVar5->var_live_ranges;
        if ((pVVar20 == (VARR_live_range_t *)0x0) ||
           ((pVVar20->varr == (live_range_t_conflict *)0x0 ||
            (pgVar31 = (gen_ctx_t)((ulong)unaff_RBP & 0xffffffff),
            (gen_ctx_t)pVVar20->els_num <= pgVar31)))) goto LAB_0016f9f6;
        plVar32 = pVVar20->varr[(long)pgVar31];
        if ((plVar32 == (live_range_t_conflict)0x0) || (plVar32->lr_bb != (lr_bb_t_conflict)0x0)) {
          __assert_fail("lr != ((void*)0) && lr->lr_bb == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x18a8,"void add_lr_bb(gen_ctx_t, MIR_reg_t, bb_t)");
        }
        plVar19 = plVar5->free_lr_bb_list;
        if (plVar19 == (lr_bb_t_conflict)0x0) {
          pgVar36 = (gen_ctx_t)&DAT_00000010;
          plVar19 = (lr_bb_t_conflict)malloc(0x10);
          if (plVar19 == (lr_bb_t_conflict)0x0) goto LAB_0016fa43;
        }
        else {
          plVar5->free_lr_bb_list = plVar19->next;
        }
        plVar19->bb = bb;
        plVar19->next = (lr_bb_t)0x0;
        plVar32->lr_bb = plVar19;
      }
    }
    goto LAB_0016f6fa;
  }
  plVar5 = gen_ctx->lr_ctx;
  if (plVar5->scan_vars_num != 0) {
LAB_0016f85a:
    pVVar6 = bb->in;
    if (pVVar6 != (bitmap_t)0x0) {
      if (pVVar6->els_num != 0) {
        sVar27 = 0;
        do {
          pgVar31 = gen_ctx;
          if (pVVar6->varr[sVar27] != 0) goto LAB_0016f9af;
          sVar27 = sVar27 + 1;
        } while (pVVar6->els_num != sVar27);
      }
      return;
    }
    goto LAB_0016fa67;
  }
  pVVar6 = bb->gen;
  if ((pVVar6 != (bitmap_t)0x0) && (pVVar6->varr != (bitmap_el_t *)0x0)) {
    pVVar6->els_num = 0;
    pVVar6 = bb->kill;
    if ((pVVar6 != (bitmap_t)0x0) && (pVVar6->varr != (bitmap_el_t *)0x0)) {
      pVVar6->els_num = 0;
      pVVar6 = plVar5->referenced_vars;
      if (pVVar6 != (bitmap_t)0x0) {
        pgVar37 = (gen_ctx_t)0x0;
        do {
          uVar22 = (ulong)pgVar37 >> 6;
          uVar35 = pVVar6->els_num;
          bVar11 = true;
          pgVar29 = pgVar37;
          if (uVar22 < uVar35) {
            pgVar36 = (gen_ctx_t)pVVar6->varr;
            pgVar31 = (gen_ctx_t)(uVar35 << 6);
LAB_0016f917:
            in_R8 = (_IO_FILE *)pgVar36->call_used_hard_regs[uVar22 - 0xd];
            if ((in_R8 == (_IO_FILE *)0x0) ||
               (in_R8 = (_IO_FILE *)((ulong)in_R8 >> ((ulong)pgVar37 & 0x3f)),
               in_R8 == (_IO_FILE *)0x0)) goto LAB_0016f92a;
            uVar35 = (ulong)in_R8 & 1;
            unaff_RBP = pgVar37;
            while (uVar35 == 0) {
              unaff_RBP = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
              uVar35 = (ulong)in_R8 & 2;
              in_R8 = (_IO_FILE *)((ulong)in_R8 >> 1);
            }
            bVar11 = false;
            pgVar29 = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
          }
LAB_0016f95e:
          if (bVar11) goto LAB_0016f85a;
          if ((gen_ctx_t)0x21 < unaff_RBP) {
            pgVar37 = (gen_ctx_t)bb->kill;
            pgVar31 = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
            pgVar36 = pgVar37;
            bitmap_expand((bitmap_t)pgVar37,(size_t)pgVar31);
            if (pgVar37 == (gen_ctx_t)0x0) {
LAB_0016fa3e:
              process_bb_ranges_cold_6();
LAB_0016fa43:
              util_error(gen_ctx,"no memory");
            }
            ppvVar3 = &pgVar37->curr_func_item->data + ((ulong)unaff_RBP >> 6);
            *ppvVar3 = (void *)((ulong)*ppvVar3 | 1L << ((ulong)unaff_RBP & 0x3f));
          }
          pgVar37 = pgVar29;
        } while (pVVar6 != (bitmap_t)0x0);
      }
      process_bb_ranges_cold_8();
LAB_0016f9af:
      piVar2 = &pgVar31->lr_ctx->curr_point;
      *piVar2 = *piVar2 + 1;
      return;
    }
    goto LAB_0016fa71;
  }
  goto LAB_0016fa6c;
LAB_0016f729:
  uVar22 = uVar22 + 1;
  pgVar37 = (gen_ctx_t)(uVar22 * 0x40);
  pgVar29 = pgVar31;
  if (uVar35 == uVar22) goto LAB_0016f75d;
  goto LAB_0016f716;
LAB_0016f92a:
  uVar22 = uVar22 + 1;
  pgVar37 = (gen_ctx_t)(uVar22 * 0x40);
  pgVar29 = pgVar31;
  if (uVar35 == uVar22) goto LAB_0016f95e;
  goto LAB_0016f917;
LAB_0016f9f6:
  process_bb_ranges_cold_4();
LAB_0016f9fb:
  __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1965,"void process_bb_ranges(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
}

Assistant:

static void process_bb_ranges (gen_ctx_t gen_ctx, bb_t bb, MIR_insn_t start_insn,
                               MIR_insn_t tail_insn) {
  MIR_reg_t var, reg, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  size_t nel;
  int scan_var, op_num, incr_p;
  bitmap_iterator_t bi;
  insn_var_iterator_t insn_var_iter;

  DEBUG (2, {
    fprintf (debug_file, "  ------BB%u end: point=%d\n", (unsigned) bb->index, curr_point);
  });
  bitmap_clear (referenced_vars);
  bitmap_clear (live_vars);
  if (bb->live_out != NULL) FOREACH_BITMAP_BIT (bi, bb->live_out, nel) {
      make_var_live (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    }
  for (MIR_insn_t insn = tail_insn;; insn = DLIST_PREV (MIR_insn_t, insn)) {
    DEBUG (2, {
      fprintf (debug_file, "  p%-5d", curr_point);
      MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    });
    if (insn->code == MIR_PHI) {
      if ((scan_var = var_to_scan_var (gen_ctx, insn->ops[0].u.var)) >= 0) {
        make_var_dead (gen_ctx, insn->ops[0].u.var, scan_var, curr_point, TRUE);
        curr_point++;
      }
      if (insn == start_insn) break;
      continue;
    }
    incr_p = FALSE;
    FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_dead (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0 && MIR_call_code_p (insn->code)) {
      if (incr_p) curr_point++;
      incr_p = FALSE;
      FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
        make_var_dead (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        incr_p = TRUE;
      }
      bitmap_t args = (optimize_level > 0 ? ((bb_insn_t) insn->data)->call_hard_reg_args
                                          : ((insn_data_t) insn->data)->u.call_hard_reg_args);
      if (args != NULL) {
        FOREACH_BITMAP_BIT (bi, args, nel) {
          make_var_live (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        }
      }
      FOREACH_BITMAP_BIT (bi, live_vars, nel) {
        MIR_reg_t live_reg;

        if (nel <= MAX_HARD_REG) continue;
        live_reg = (MIR_reg_t) nel;
        bitmap_set_bit_p (curr_cfg->call_crossed_regs, live_reg);
      }
    }
    if (incr_p) curr_point++;
    incr_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_live (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0) {
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if ((reg = early_clobbered_hard_reg1) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
      if ((reg = early_clobbered_hard_reg2) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
    }
    if (incr_p) curr_point++;
    if (insn == start_insn) break;
  }
  gen_assert (bitmap_equal_p (bb->live_in, live_vars));
  FOREACH_BITMAP_BIT (bi, bb->live_in, nel) {
    make_var_dead (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    if (scan_vars_num == 0 && !bitmap_bit_p (referenced_vars, nel))
      add_lr_bb (gen_ctx, (MIR_reg_t) nel, bb);
  }
  if (scan_vars_num == 0) { /* setup spill info for RA */
    bitmap_clear (bb->spill_gen);
    bitmap_clear (bb->spill_kill);
    FOREACH_BITMAP_BIT (bi, referenced_vars, nel) {
      if (nel > MAX_HARD_REG) bitmap_set_bit_p (bb->spill_kill, nel);
    }
  }
  if (!bitmap_empty_p (bb->live_in)) curr_point++;
}